

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred.c
# Opt level: O3

void aom_dc_predictor_32x64_c(uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left)

{
  undefined1 auVar1 [13];
  undefined1 auVar2 [13];
  undefined1 auVar3 [13];
  undefined1 auVar4 [13];
  undefined1 auVar5 [13];
  undefined1 auVar6 [13];
  ulong uVar7;
  undefined1 auVar8 [13];
  undefined1 auVar9 [13];
  int iVar10;
  long lVar11;
  undefined1 uVar12;
  undefined4 uVar13;
  undefined1 auVar14 [16];
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  
  lVar11 = 0;
  iVar15 = 0;
  iVar16 = 0;
  iVar17 = 0;
  iVar18 = 0;
  do {
    uVar13 = *(undefined4 *)(above + lVar11);
    uVar7 = (ulong)(ushort)uVar13 & 0xffffffffffff00ff;
    auVar1._8_4_ = 0;
    auVar1._0_8_ = uVar7;
    auVar1[0xc] = (char)((uint)uVar13 >> 0x18);
    auVar2[8] = (char)((uint)uVar13 >> 0x10);
    auVar2._0_8_ = uVar7;
    auVar2[9] = 0;
    auVar2._10_3_ = auVar1._10_3_;
    auVar8._5_8_ = 0;
    auVar8._0_5_ = auVar2._8_5_;
    auVar3[4] = (char)((uint)uVar13 >> 8);
    auVar3._0_4_ = (int)uVar7;
    auVar3[5] = 0;
    auVar3._6_7_ = SUB137(auVar8 << 0x40,6);
    iVar15 = iVar15 + (int)uVar7;
    iVar16 = iVar16 + auVar3._4_4_;
    iVar17 = iVar17 + auVar2._8_4_;
    iVar18 = iVar18 + (uint)(uint3)(auVar1._10_3_ >> 0x10);
    lVar11 = lVar11 + 4;
  } while (lVar11 != 0x20);
  iVar15 = iVar18 + iVar16 + iVar17 + iVar15;
  iVar16 = 0;
  iVar17 = 0;
  iVar18 = 0;
  lVar11 = 0;
  do {
    uVar13 = *(undefined4 *)(left + lVar11);
    uVar7 = (ulong)(ushort)uVar13 & 0xffffffffffff00ff;
    auVar4._8_4_ = 0;
    auVar4._0_8_ = uVar7;
    auVar4[0xc] = (char)((uint)uVar13 >> 0x18);
    auVar5[8] = (char)((uint)uVar13 >> 0x10);
    auVar5._0_8_ = uVar7;
    auVar5[9] = 0;
    auVar5._10_3_ = auVar4._10_3_;
    auVar9._5_8_ = 0;
    auVar9._0_5_ = auVar5._8_5_;
    auVar6[4] = (char)((uint)uVar13 >> 8);
    auVar6._0_4_ = (int)uVar7;
    auVar6[5] = 0;
    auVar6._6_7_ = SUB137(auVar9 << 0x40,6);
    iVar15 = iVar15 + (int)uVar7;
    iVar16 = iVar16 + auVar6._4_4_;
    iVar17 = iVar17 + auVar5._8_4_;
    iVar18 = iVar18 + (uint)(uint3)(auVar4._10_3_ >> 0x10);
    lVar11 = lVar11 + 4;
  } while (lVar11 != 0x40);
  iVar10 = 0x40;
  uVar12 = (undefined1)((iVar18 + iVar16 + iVar17 + iVar15 + 0x30U >> 5) * 0x5556 >> 0x10);
  auVar14 = ZEXT216(CONCAT11(uVar12,uVar12));
  auVar14 = pshuflw(auVar14,auVar14,0);
  uVar13 = auVar14._0_4_;
  do {
    *(undefined4 *)(dst + 0x10) = uVar13;
    *(undefined4 *)(dst + 0x14) = uVar13;
    *(undefined4 *)(dst + 0x18) = uVar13;
    *(undefined4 *)(dst + 0x1c) = uVar13;
    *(undefined4 *)dst = uVar13;
    *(undefined4 *)(dst + 4) = uVar13;
    *(undefined4 *)(dst + 8) = uVar13;
    *(undefined4 *)(dst + 0xc) = uVar13;
    dst = dst + stride;
    iVar10 = iVar10 + -1;
  } while (iVar10 != 0);
  return;
}

Assistant:

void aom_dc_predictor_32x64_c(uint8_t *dst, ptrdiff_t stride,
                              const uint8_t *above, const uint8_t *left) {
  dc_predictor_rect(dst, stride, 32, 64, above, left, 5, DC_MULTIPLIER_1X2);
}